

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

int g_read(lua_State *L,FILE *f,int first)

{
  char cVar1;
  lua_State *plVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  lconv *plVar9;
  ushort **ppuVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  bool bVar14;
  char local_2072 [2];
  lua_State *local_2070;
  uint local_2064;
  ulong local_2060;
  char *local_2058;
  luaL_Buffer local_2050;
  
  uVar11 = (ulong)(uint)first;
  iVar3 = lua_gettop(L);
  clearerr((FILE *)f);
  iVar12 = iVar3 + -1;
  local_2070 = L;
  if (iVar12 == 0) {
    uVar13 = read_line(L,f,1);
    iVar3 = first + 1;
  }
  else {
    luaL_checkstack(L,iVar3 + 0x13,"too many arguments");
    uVar13 = 1;
    local_2060 = uVar11;
    while( true ) {
      plVar2 = local_2070;
      iVar3 = (int)uVar11;
      bVar14 = iVar12 == 0;
      iVar12 = iVar12 + -1;
      if ((bVar14) || (uVar13 == 0)) break;
      iVar4 = lua_type(local_2070,iVar3);
      if (iVar4 == 3) {
        sVar6 = luaL_checkinteger(plVar2,iVar3);
        if (sVar6 == 0) {
          iVar4 = getc((FILE *)f);
          ungetc(iVar4,(FILE *)f);
          lua_pushstring(plVar2,"");
          uVar13 = (uint)(iVar4 != -1);
        }
        else {
          luaL_buffinit(plVar2,&local_2050);
          pcVar7 = luaL_prepbuffsize(&local_2050,sVar6);
          sVar8 = fread(pcVar7,1,sVar6,(FILE *)f);
          local_2050.n = local_2050.n + sVar8;
          luaL_pushresult(&local_2050);
          uVar13 = (uint)(sVar8 != 0);
        }
      }
      else {
        pcVar7 = luaL_checklstring(plVar2,iVar3,(size_t *)0x0);
        cVar1 = pcVar7[*pcVar7 == '*'];
        if (cVar1 == 'L') {
          iVar4 = 0;
LAB_0011455a:
          uVar13 = read_line(plVar2,f,iVar4);
        }
        else if (cVar1 == 'a') {
          luaL_buffinit(plVar2,&local_2050);
          do {
            pcVar7 = luaL_prepbuffsize(&local_2050,0x2000);
            sVar8 = fread(pcVar7,1,0x2000,(FILE *)f);
            local_2050.n = local_2050.n + sVar8;
          } while (sVar8 == 0x2000);
          luaL_pushresult(&local_2050);
          uVar13 = 1;
        }
        else {
          if (cVar1 == 'l') {
            iVar4 = 1;
            goto LAB_0011455a;
          }
          if (cVar1 != 'n') {
            iVar3 = luaL_argerror(plVar2,iVar3,"invalid format");
            return iVar3;
          }
          local_2050.size._4_4_ = 0;
          local_2050.b = (char *)f;
          plVar9 = localeconv();
          local_2072[0] = *plVar9->decimal_point;
          local_2072[1] = 0x2e;
          do {
            iVar4 = getc((FILE *)f);
            ppuVar10 = __ctype_b_loc();
          } while ((*(byte *)((long)*ppuVar10 + (long)iVar4 * 2 + 1) & 0x20) != 0);
          local_2050.size._0_4_ = iVar4;
          test2((RN *)&local_2050,"-+");
          iVar4 = test2((RN *)&local_2050,"00");
          if (iVar4 == 0) {
            uVar13 = 0;
            local_2058 = "eE";
            local_2064 = 0;
          }
          else {
            local_2064 = test2((RN *)&local_2050,"xX");
            uVar13 = local_2064 ^ 1;
            local_2058 = "pP";
            if (local_2064 == 0) {
              local_2058 = "eE";
            }
          }
          iVar4 = readdigits((RN *)&local_2050,local_2064);
          iVar4 = iVar4 + uVar13;
          iVar5 = test2((RN *)&local_2050,local_2072);
          if (iVar5 != 0) {
            iVar5 = readdigits((RN *)&local_2050,local_2064);
            iVar4 = iVar4 + iVar5;
          }
          if ((0 < iVar4) && (iVar4 = test2((RN *)&local_2050,local_2058), iVar4 != 0)) {
            test2((RN *)&local_2050,"-+");
            readdigits((RN *)&local_2050,0);
          }
          ungetc((int)local_2050.size,(FILE *)local_2050.b);
          plVar2 = local_2070;
          local_2050.initb[(long)local_2050.size._4_4_ + -0x10] = '\0';
          sVar6 = lua_stringtonumber(local_2070,(char *)&local_2050.n);
          uVar13 = 1;
          if (sVar6 == 0) {
            lua_pushnil(plVar2);
            uVar13 = 0;
          }
        }
      }
      uVar11 = (ulong)(iVar3 + 1);
    }
    first = (int)local_2060;
  }
  iVar12 = ferror((FILE *)f);
  plVar2 = local_2070;
  if (iVar12 == 0) {
    if (uVar13 == 0) {
      lua_settop(local_2070,-2);
      lua_pushnil(plVar2);
    }
    iVar3 = iVar3 - first;
  }
  else {
    iVar3 = luaL_fileresult(local_2070,0,(char *)0x0);
  }
  return iVar3;
}

Assistant:

static int g_read (lua_State *L, FILE *f, int first) {
  int nargs = lua_gettop(L) - 1;
  int success;
  int n;
  clearerr(f);
  if (nargs == 0) {  /* no arguments? */
    success = read_line(L, f, 1);
    n = first+1;  /* to return 1 result */
  }
  else {  /* ensure stack space for all results and for auxlib's buffer */
    luaL_checkstack(L, nargs+LUA_MINSTACK, "too many arguments");
    success = 1;
    for (n = first; nargs-- && success; n++) {
      if (lua_type(L, n) == LUA_TNUMBER) {
        size_t l = (size_t)luaL_checkinteger(L, n);
        success = (l == 0) ? test_eof(L, f) : read_chars(L, f, l);
      }
      else {
        const char *p = luaL_checkstring(L, n);
        if (*p == '*') p++;  /* skip optional '*' (for compatibility) */
        switch (*p) {
          case 'n':  /* number */
            success = read_number(L, f);
            break;
          case 'l':  /* line */
            success = read_line(L, f, 1);
            break;
          case 'L':  /* line with end-of-line */
            success = read_line(L, f, 0);
            break;
          case 'a':  /* file */
            read_all(L, f);  /* read entire file */
            success = 1; /* always success */
            break;
          default:
            return luaL_argerror(L, n, "invalid format");
        }
      }
    }
  }
  if (ferror(f))
    return luaL_fileresult(L, 0, NULL);
  if (!success) {
    lua_pop(L, 1);  /* remove last result */
    lua_pushnil(L);  /* push nil instead */
  }
  return n - first;
}